

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O2

Int __thiscall
ipx::LpSolver::LoadIPMStartingPoint
          (LpSolver *this,double *x,double *xl,double *xu,double *slack,double *y,double *zl,
          double *zu)

{
  Int IVar1;
  size_t __n;
  size_t __n_00;
  
  __n_00 = (size_t)(this->model_).num_rows_;
  __n = (long)(this->model_).num_cols_ + __n_00;
  std::valarray<double>::resize(&this->x_start_,__n,0.0);
  std::valarray<double>::resize(&this->xl_start_,__n,0.0);
  std::valarray<double>::resize(&this->xu_start_,__n,0.0);
  std::valarray<double>::resize(&this->y_start_,__n_00,0.0);
  std::valarray<double>::resize(&this->zl_start_,__n,0.0);
  std::valarray<double>::resize(&this->zu_start_,__n,0.0);
  IVar1 = Model::PresolveIPMStartingPoint
                    (&this->model_,x,xl,xu,slack,y,zl,zu,&this->x_start_,&this->xl_start_,
                     &this->xu_start_,&this->y_start_,&this->zl_start_,&this->zu_start_);
  if (IVar1 == 0) {
    MakeIPMStartingPointValid(this);
  }
  else {
    ClearIPMStartingPoint(this);
  }
  return IVar1;
}

Assistant:

Int LpSolver::LoadIPMStartingPoint(const double* x, const double* xl,
                                   const double* xu, const double* slack,
                                   const double* y, const double* zl,
                                   const double* zu) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    x_start_.resize(n+m);
    xl_start_.resize(n+m);
    xu_start_.resize(n+m);
    y_start_.resize(m);
    zl_start_.resize(n+m);
    zu_start_.resize(n+m);
    Int errflag = model_.PresolveIPMStartingPoint(x, xl, xu, slack, y, zl, zu,
                                                  x_start_, xl_start_,
                                                  xu_start_, y_start_,
                                                  zl_start_, zu_start_);
    if (errflag) {
        ClearIPMStartingPoint();
        return errflag;
    }
    MakeIPMStartingPointValid();
    return 0;
}